

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.h
# Opt level: O0

void __thiscall
Move::Move(Move *this,string *word,int r,int c,int bsize,bool across,int score,int blank_pos,int h)

{
  bool across_local;
  int bsize_local;
  int c_local;
  int r_local;
  string *word_local;
  Move *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->heur_score = 0;
  std::__cxx11::string::string((string *)&this->swap_letters);
  this->bsize = bsize;
  set_all(this,word,r,c,across,score,blank_pos,h);
  return;
}

Assistant:

Move(const std::string &word, int r, int c, int bsize, bool across = true, int score = 0, int blank_pos = -1,
         int h = 0) {
        this->bsize = bsize;
        this->set_all(word, r, c, across, score, blank_pos, h);
    }